

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  _Alloc_hider _Var3;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar2 = std::__cxx11::string::rfind((char)arg,0x3d);
  if (lVar2 == -1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,arg,&local_38);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)arg);
    std::__cxx11::string::substr((ulong)&local_58,(ulong)arg);
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p == &local_68) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_68._8_8_;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_78._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity =
           CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
    }
    (__return_storage_ptr__->first)._M_string_length = local_70;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    paVar1 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
    if (local_58._M_p == &local_48) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_40;
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = local_58._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity = CONCAT71(uStack_47,local_48);
    }
    (__return_storage_ptr__->second)._M_string_length = local_50;
    local_50 = 0;
    local_48 = '\0';
    local_78._M_p = (pointer)&local_68;
    local_58._M_p = &local_48;
  }
  if (lVar2 == -1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return __return_storage_ptr__;
    }
    lVar2 = CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
    _Var3._M_p = local_38._M_dataplus._M_p;
  }
  else {
    if (local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,CONCAT71(uStack_47,local_48) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p == &local_68) {
      return __return_storage_ptr__;
    }
    lVar2 = CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
    _Var3._M_p = local_78._M_p;
  }
  operator_delete(_Var3._M_p,lVar2 + 1);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}